

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

void luaS_resize(lua_State *L,int nsize)

{
  int osize;
  global_State *pgVar1;
  TString **vect;
  int osize_00;
  
  pgVar1 = L->l_G;
  osize = (pgVar1->strt).size;
  if (nsize < osize) {
    tablerehash((pgVar1->strt).hash,osize,nsize);
  }
  vect = (TString **)luaM_realloc_(L,(pgVar1->strt).hash,(long)osize * 8,(long)nsize << 3);
  if (vect == (TString **)0x0) {
    if (osize <= nsize) {
      return;
    }
    vect = (pgVar1->strt).hash;
    osize_00 = nsize;
    nsize = osize;
  }
  else {
    (pgVar1->strt).hash = vect;
    (pgVar1->strt).size = nsize;
    osize_00 = osize;
    if (nsize <= osize) {
      return;
    }
  }
  tablerehash(vect,osize_00,nsize);
  return;
}

Assistant:

void luaS_resize (lua_State *L, int nsize) {
  stringtable *tb = &G(L)->strt;
  int osize = tb->size;
  TString **newvect;
  if (nsize < osize)  /* shrinking table? */
    tablerehash(tb->hash, osize, nsize);  /* depopulate shrinking part */
  newvect = luaM_reallocvector(L, tb->hash, osize, nsize, TString*);
  if (l_unlikely(newvect == NULL)) {  /* reallocation failed? */
    if (nsize < osize)  /* was it shrinking table? */
      tablerehash(tb->hash, nsize, osize);  /* restore to original size */
    /* leave table as it was */
  }
  else {  /* allocation succeeded */
    tb->hash = newvect;
    tb->size = nsize;
    if (nsize > osize)
      tablerehash(newvect, osize, nsize);  /* rehash for new size */
  }
}